

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

char * mpack_expect_bin_alloc(mpack_reader_t *reader,size_t maxsize,size_t *size)

{
  uint32_t uVar1;
  char *pcVar2;
  char *data;
  size_t length;
  size_t *size_local;
  size_t maxsize_local;
  mpack_reader_t *reader_local;
  
  *size = 0;
  size_local = (size_t *)maxsize;
  if (0xffffffff < maxsize) {
    size_local = (size_t *)0xffffffff;
  }
  uVar1 = mpack_expect_bin_max(reader,(uint32_t)size_local);
  pcVar2 = mpack_read_bytes_alloc(reader,(ulong)uVar1);
  mpack_done_bin(reader);
  if (pcVar2 != (char *)0x0) {
    *size = (ulong)uVar1;
  }
  return pcVar2;
}

Assistant:

char* mpack_expect_bin_alloc(mpack_reader_t* reader, size_t maxsize, size_t* size) {
    mpack_assert(size != NULL, "size cannot be NULL");
    *size = 0;

    if (maxsize > UINT32_MAX)
        maxsize = UINT32_MAX;

    size_t length = mpack_expect_bin_max(reader, (uint32_t)maxsize);
    char* data = mpack_read_bytes_alloc(reader, length);
    mpack_done_bin(reader);

    if (data)
        *size = length;
    return data;
}